

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,LIBSSH2_SFTP_ATTRIBUTES *attrs,int setstat)

{
  LIBSSH2_SFTP *sftp;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  ulong uVar6;
  ssize_t sVar7;
  char *errmsg;
  ulong uVar8;
  uchar *s;
  size_t data_len;
  size_t in_stack_ffffffffffffff88;
  byte *local_68;
  char *local_60;
  LIBSSH2_SFTP_ATTRIBUTES *local_58;
  uchar *local_50;
  char *local_48;
  char *local_40;
  time_t local_38;
  
  iVar3 = -0x27;
  if (attrs != (LIBSSH2_SFTP_ATTRIBUTES *)0x0 && hnd != (LIBSSH2_SFTP_HANDLE *)0x0) {
    local_58 = attrs;
    local_38 = time((time_t *)0x0);
    local_48 = "Unable to send FXP_FSETSTAT";
    if (setstat == 0) {
      local_48 = "Unable to send FXP_FSTAT command";
    }
    local_40 = hnd->handle;
    do {
      sftp = hnd->sftp;
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_50 = (uchar *)0x0;
      if (setstat == 0) {
        lVar5 = 0;
      }
      else {
        uVar2 = (uint)local_58->flags;
        lVar5 = (ulong)(uVar2 & 0xc) + (ulong)(uVar2 & 1) * 8 + (ulong)(uVar2 & 2) * 4 + 4;
      }
      uVar8 = hnd->handle_len + 0xd + lVar5;
      local_60 = (char *)0x0;
      if (sftp->fstat_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        local_68 = (byte *)(*pLVar1->alloc)(uVar8 & 0xffffffff,&pLVar1->abstract);
        sftp->fstat_packet = local_68;
        if (local_68 != (byte *)0x0) {
          _libssh2_store_u32(&local_68,(int)uVar8 - 4);
          *local_68 = (setstat != 0) * '\x02' | 8;
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          sftp->fstat_request_id = uVar4;
          local_68 = local_68 + 1;
          _libssh2_store_u32(&local_68,uVar4);
          _libssh2_store_str(&local_68,local_40,hnd->handle_len);
          if (setstat != 0) {
            sVar7 = sftp_attr2bin(local_68,local_58);
            local_68 = local_68 + sVar7;
          }
          sftp->fstat_state = libssh2_NB_state_created;
          goto LAB_001244d7;
        }
        iVar3 = -6;
        errmsg = "Unable to allocate memory for FSTAT/FSETSTAT packet";
        local_68 = (byte *)0x0;
LAB_0012464d:
        iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
      else {
        if (sftp->fstat_state != libssh2_NB_state_created) {
LAB_00124520:
          iVar3 = sftp_packet_requirev
                            (sftp,0x1319ee,(uchar *)(ulong)sftp->fstat_request_id,
                             (uint32_t)&local_60,&local_50,(size_t *)0x9,in_stack_ffffffffffffff88);
          if (iVar3 == 0) {
            sftp->fstat_state = libssh2_NB_state_idle;
            if (*local_60 == 'e') {
              uVar4 = _libssh2_ntohu32((uchar *)(local_60 + 5));
              (*pLVar1->free)(local_60,&pLVar1->abstract);
              if (uVar4 == 0) {
                return 0;
              }
              sftp->last_errno = uVar4;
              iVar3 = -0x1f;
              errmsg = "SFTP Protocol Error";
            }
            else {
              sVar7 = sftp_bin2attr(local_58,(uchar *)(local_60 + 5),(size_t)(local_50 + -5));
              (*pLVar1->free)(local_60,&pLVar1->abstract);
              if (-1 < sVar7) {
                return 0;
              }
              iVar3 = -0x1f;
              errmsg = "Attributes too short in SFTP fstat";
            }
          }
          else {
            if (iVar3 == -0x25) goto LAB_00124657;
            if (iVar3 == -0x26) {
              if (local_50 != (uchar *)0x0) {
                (*pLVar1->free)(local_60,&pLVar1->abstract);
              }
              iVar3 = -0x1f;
              errmsg = "SFTP fstat packet too short";
            }
            else {
              sftp->fstat_state = libssh2_NB_state_idle;
              errmsg = "Timeout waiting for status message";
            }
          }
          goto LAB_0012464d;
        }
LAB_001244d7:
        uVar6 = _libssh2_channel_write(channel,0,sftp->fstat_packet,uVar8 & 0xffffffff);
        if (uVar6 != 0xffffffffffffffdb) {
          (*pLVar1->free)(sftp->fstat_packet,&pLVar1->abstract);
          sftp->fstat_packet = (uchar *)0x0;
          if ((uVar8 & 0xffffffff) != uVar6) {
            sftp->fstat_state = libssh2_NB_state_idle;
            iVar3 = -7;
            errmsg = local_48;
            goto LAB_0012464d;
          }
          sftp->fstat_state = libssh2_NB_state_sent;
          goto LAB_00124520;
        }
      }
LAB_00124657:
      pLVar1 = hnd->sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,
                      LIBSSH2_SFTP_ATTRIBUTES *attrs, int setstat)
{
    int rc;
    if(!hnd || !attrs)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_fstat(hnd, attrs, setstat));
    return rc;
}